

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O0

u64 __thiscall idx2::GetLinearBrick(idx2 *this,idx2_file *Idx2,int Level,v3i Brick3)

{
  byte bVar1;
  int iVar2;
  undefined4 in_register_00000014;
  uint local_98;
  int D;
  int I;
  int Size;
  u64 LinearBrick;
  int Level_local;
  idx2_file *Idx2_local;
  undefined8 local_64;
  v3i Brick3_local;
  
  local_64 = CONCAT44(in_register_00000014,Level);
  Brick3_local.field_0.field_0.X = Brick3.field_0._0_4_;
  _I = 0;
  bVar1 = *(byte *)(*(long *)(this + 0x640) + (long)(int)Idx2 * 0x81 + 0x80);
  local_98 = (uint)bVar1;
  while( true ) {
    local_98 = local_98 - 1;
    if ((int)local_98 < 0) {
      return _I;
    }
    Brick3_local.field_0.field_4.YZ.field_0 = (v2<int>)(long)(int)Idx2;
    if (0x7f < (int)local_98) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x237,"char &idx2::stack_string<128>::operator[](int) const [N = 128]");
    }
    iVar2 = *(char *)(*(long *)(this + 0x640) + (long)Brick3_local.field_0.field_4.YZ.field_0 * 0x81
                     + (long)(int)local_98) + -0x58;
    if (2 < iVar2) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    _I = ((long)*(int *)((long)&local_64 + (long)iVar2 * 4) & 1U) <<
         ((bVar1 - (char)local_98) - 1 & 0x3f) | _I;
    if (2 < iVar2) break;
    *(int *)((long)&local_64 + (long)iVar2 * 4) = *(int *)((long)&local_64 + (long)iVar2 * 4) >> 1;
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

u64
GetLinearBrick(const idx2_file& Idx2, int Level, v3i Brick3)
{
  u64 LinearBrick = 0;
  int Size = Idx2.BricksOrderStr[Level].Len;
  for (int I = Size - 1; I >= 0; --I)
  {
    int D = Idx2.BricksOrderStr[Level][I] - 'X';
    LinearBrick |= (Brick3[D] & u64(1)) << (Size - I - 1);
    Brick3[D] >>= 1;
  }
  return LinearBrick;
}